

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_database.cc
# Opt level: O0

bool __thiscall
google::protobuf::SimpleDescriptorDatabase::DescriptorIndex<std::pair<const_void_*,_int>_>::
AddSymbol(DescriptorIndex<std::pair<const_void_*,_int>_> *this,string *name,
         pair<const_void_*,_int> value)

{
  bool bVar1;
  pair<const_void_*,_int> *__y;
  long in_RDI;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_void_*,_int>_>_>,_bool>
  pVar2;
  iterator iter;
  undefined4 in_stack_fffffffffffffda8;
  int in_stack_fffffffffffffdac;
  LogMessage *in_stack_fffffffffffffdb0;
  DescriptorIndex<std::pair<const_void_*,_int>_> *in_stack_fffffffffffffdb8;
  const_iterator __position;
  DescriptorIndex<std::pair<const_void_*,_int>_> *in_stack_fffffffffffffdc0;
  bool local_1f9;
  _Rb_tree_node_base local_180;
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_void_*,_int>_>_>
  local_150 [9];
  _Self local_108 [9];
  _Base_ptr local_c0;
  undefined1 local_b8;
  _Self local_80;
  _Self local_78 [14];
  bool local_1;
  
  bVar1 = ValidateSymbolName(in_stack_fffffffffffffdb8,(string *)in_stack_fffffffffffffdb0);
  if (bVar1) {
    local_78[0]._M_node =
         (_Base_ptr)
         FindLastLessOrEqual(in_stack_fffffffffffffdb8,(string *)in_stack_fffffffffffffdb0);
    local_80._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_void_*,_int>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_void_*,_int>_>_>_>
         ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_void_*,_int>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_void_*,_int>_>_>_>
                *)CONCAT44(in_stack_fffffffffffffdac,in_stack_fffffffffffffda8));
    bVar1 = std::operator==(local_78,&local_80);
    if (bVar1) {
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_void_*,_int>_>
      ::pair<std::pair<const_void_*,_int>_&,_true>
                ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_void_*,_int>_>
                  *)in_stack_fffffffffffffdc0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffdb8,(pair<const_void_*,_int> *)in_stack_fffffffffffffdb0);
      pVar2 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_void_*,_int>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_void_*,_int>_>_>_>
              ::insert(&in_stack_fffffffffffffdc0->by_name_,(value_type *)in_stack_fffffffffffffdb8)
      ;
      local_c0 = (_Base_ptr)pVar2.first._M_node;
      local_b8 = pVar2.second;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_void_*,_int>_>
      ::~pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_void_*,_int>_>
               *)0x6be203);
      local_1 = true;
    }
    else {
      std::
      _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_void_*,_int>_>_>
      ::operator->((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_void_*,_int>_>_>
                    *)0x6be243);
      bVar1 = IsSubSymbol(in_stack_fffffffffffffdc0,(string *)in_stack_fffffffffffffdb8,
                          (string *)in_stack_fffffffffffffdb0);
      if (bVar1) {
        internal::LogMessage::LogMessage
                  ((LogMessage *)in_stack_fffffffffffffdc0,
                   (LogLevel)((ulong)in_stack_fffffffffffffdb8 >> 0x20),
                   (char *)in_stack_fffffffffffffdb0,in_stack_fffffffffffffdac);
        internal::LogMessage::operator<<
                  (in_stack_fffffffffffffdb0,
                   (char *)CONCAT44(in_stack_fffffffffffffdac,in_stack_fffffffffffffda8));
        internal::LogMessage::operator<<
                  (in_stack_fffffffffffffdb0,
                   (string *)CONCAT44(in_stack_fffffffffffffdac,in_stack_fffffffffffffda8));
        internal::LogMessage::operator<<
                  (in_stack_fffffffffffffdb0,
                   (char *)CONCAT44(in_stack_fffffffffffffdac,in_stack_fffffffffffffda8));
        std::
        _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_void_*,_int>_>_>
        ::operator->((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_void_*,_int>_>_>
                      *)0x6be2e9);
        internal::LogMessage::operator<<
                  (in_stack_fffffffffffffdb0,
                   (string *)CONCAT44(in_stack_fffffffffffffdac,in_stack_fffffffffffffda8));
        internal::LogMessage::operator<<
                  (in_stack_fffffffffffffdb0,
                   (char *)CONCAT44(in_stack_fffffffffffffdac,in_stack_fffffffffffffda8));
        internal::LogFinisher::operator=
                  ((LogFinisher *)in_stack_fffffffffffffdb0,
                   (LogMessage *)CONCAT44(in_stack_fffffffffffffdac,in_stack_fffffffffffffda8));
        internal::LogMessage::~LogMessage((LogMessage *)0x6be336);
        local_1 = false;
      }
      else {
        std::
        _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_void_*,_int>_>_>
        ::operator++((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_void_*,_int>_>_>
                      *)in_stack_fffffffffffffdb0);
        local_108[0]._M_node =
             (_Base_ptr)
             std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_void_*,_int>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_void_*,_int>_>_>_>
             ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_void_*,_int>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_void_*,_int>_>_>_>
                    *)CONCAT44(in_stack_fffffffffffffdac,in_stack_fffffffffffffda8));
        bVar1 = std::operator!=(local_78,local_108);
        local_1f9 = false;
        if (bVar1) {
          std::
          _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_void_*,_int>_>_>
          ::operator->((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_void_*,_int>_>_>
                        *)0x6be3cd);
          local_1f9 = IsSubSymbol(in_stack_fffffffffffffdc0,(string *)in_stack_fffffffffffffdb8,
                                  (string *)in_stack_fffffffffffffdb0);
        }
        if (local_1f9 == false) {
          __y = (pair<const_void_*,_int> *)(in_RDI + 0x30);
          std::
          _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_void_*,_int>_>_>
          ::_Rb_tree_const_iterator(local_150,local_78);
          __position._M_node = &local_180;
          std::
          pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_void_*,_int>_>
          ::pair<std::pair<const_void_*,_int>_&,_true>
                    ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_void_*,_int>_>
                      *)in_stack_fffffffffffffdc0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     __position._M_node,__y);
          std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_void_*,_int>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_void_*,_int>_>_>_>
          ::insert((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_void_*,_int>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_void_*,_int>_>_>_>
                    *)__y,__position,
                   (value_type *)CONCAT44(in_stack_fffffffffffffdac,in_stack_fffffffffffffda8));
          std::
          pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_void_*,_int>_>
          ::~pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_void_*,_int>_>
                   *)0x6be56c);
          local_1 = true;
        }
        else {
          internal::LogMessage::LogMessage
                    ((LogMessage *)in_stack_fffffffffffffdc0,
                     (LogLevel)((ulong)in_stack_fffffffffffffdb8 >> 0x20),
                     (char *)in_stack_fffffffffffffdb0,in_stack_fffffffffffffdac);
          internal::LogMessage::operator<<
                    (in_stack_fffffffffffffdb0,
                     (char *)CONCAT44(in_stack_fffffffffffffdac,in_stack_fffffffffffffda8));
          internal::LogMessage::operator<<
                    (in_stack_fffffffffffffdb0,
                     (string *)CONCAT44(in_stack_fffffffffffffdac,in_stack_fffffffffffffda8));
          internal::LogMessage::operator<<
                    (in_stack_fffffffffffffdb0,
                     (char *)CONCAT44(in_stack_fffffffffffffdac,in_stack_fffffffffffffda8));
          std::
          _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_void_*,_int>_>_>
          ::operator->((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_void_*,_int>_>_>
                        *)0x6be46c);
          internal::LogMessage::operator<<
                    (in_stack_fffffffffffffdb0,
                     (string *)CONCAT44(in_stack_fffffffffffffdac,in_stack_fffffffffffffda8));
          internal::LogMessage::operator<<
                    (in_stack_fffffffffffffdb0,
                     (char *)CONCAT44(in_stack_fffffffffffffdac,in_stack_fffffffffffffda8));
          internal::LogFinisher::operator=
                    ((LogFinisher *)in_stack_fffffffffffffdb0,
                     (LogMessage *)CONCAT44(in_stack_fffffffffffffdac,in_stack_fffffffffffffda8));
          internal::LogMessage::~LogMessage((LogMessage *)0x6be4b9);
          local_1 = false;
        }
      }
    }
  }
  else {
    internal::LogMessage::LogMessage
              ((LogMessage *)in_stack_fffffffffffffdc0,
               (LogLevel)((ulong)in_stack_fffffffffffffdb8 >> 0x20),
               (char *)in_stack_fffffffffffffdb0,in_stack_fffffffffffffdac);
    internal::LogMessage::operator<<
              (in_stack_fffffffffffffdb0,
               (char *)CONCAT44(in_stack_fffffffffffffdac,in_stack_fffffffffffffda8));
    internal::LogMessage::operator<<
              (in_stack_fffffffffffffdb0,
               (string *)CONCAT44(in_stack_fffffffffffffdac,in_stack_fffffffffffffda8));
    internal::LogFinisher::operator=
              ((LogFinisher *)in_stack_fffffffffffffdb0,
               (LogMessage *)CONCAT44(in_stack_fffffffffffffdac,in_stack_fffffffffffffda8));
    internal::LogMessage::~LogMessage((LogMessage *)0x6be0f2);
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool SimpleDescriptorDatabase::DescriptorIndex<Value>::AddSymbol(
    const std::string& name, Value value) {
  // We need to make sure not to violate our map invariant.

  // If the symbol name is invalid it could break our lookup algorithm (which
  // relies on the fact that '.' sorts before all other characters that are
  // valid in symbol names).
  if (!ValidateSymbolName(name)) {
    GOOGLE_LOG(ERROR) << "Invalid symbol name: " << name;
    return false;
  }

  // Try to look up the symbol to make sure a super-symbol doesn't already
  // exist.
  typename std::map<std::string, Value>::iterator iter =
      FindLastLessOrEqual(name);

  if (iter == by_symbol_.end()) {
    // Apparently the map is currently empty.  Just insert and be done with it.
    by_symbol_.insert(
        typename std::map<std::string, Value>::value_type(name, value));
    return true;
  }

  if (IsSubSymbol(iter->first, name)) {
    GOOGLE_LOG(ERROR) << "Symbol name \"" << name
               << "\" conflicts with the existing "
                  "symbol \""
               << iter->first << "\".";
    return false;
  }

  // OK, that worked.  Now we have to make sure that no symbol in the map is
  // a sub-symbol of the one we are inserting.  The only symbol which could
  // be so is the first symbol that is greater than the new symbol.  Since
  // |iter| points at the last symbol that is less than or equal, we just have
  // to increment it.
  ++iter;

  if (iter != by_symbol_.end() && IsSubSymbol(name, iter->first)) {
    GOOGLE_LOG(ERROR) << "Symbol name \"" << name
               << "\" conflicts with the existing "
                  "symbol \""
               << iter->first << "\".";
    return false;
  }

  // OK, no conflicts.

  // Insert the new symbol using the iterator as a hint, the new entry will
  // appear immediately before the one the iterator is pointing at.
  by_symbol_.insert(
      iter, typename std::map<std::string, Value>::value_type(name, value));

  return true;
}